

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O0

ConversionResult
llvm::ConvertUTF8toUTF32Impl
          (UTF8 **sourceStart,UTF8 *sourceEnd,UTF32 **targetStart,UTF32 *targetEnd,
          ConversionFlags flags,Boolean InputIsPartial)

{
  Boolean BVar1;
  ushort uVar2;
  uint uVar3;
  int local_4c;
  unsigned_short extraBytesToRead;
  uint *puStack_48;
  UTF32 ch;
  UTF32 *target;
  UTF8 *source;
  ConversionResult result;
  Boolean InputIsPartial_local;
  ConversionFlags flags_local;
  UTF32 *targetEnd_local;
  UTF32 **targetStart_local;
  UTF8 *sourceEnd_local;
  UTF8 **sourceStart_local;
  
  source._4_4_ = conversionOK;
  target = (UTF32 *)*sourceStart;
  puStack_48 = *targetStart;
LAB_00207a0f:
  do {
    if (sourceEnd <= target) {
LAB_00207ca4:
      *sourceStart = (UTF8 *)target;
      *targetStart = puStack_48;
      return source._4_4_;
    }
    local_4c = 0;
    uVar2 = (ushort)(char)trailingBytesForUTF8[(byte)*target];
    if ((long)(ulong)uVar2 < (long)sourceEnd - (long)target) {
      if (targetEnd <= puStack_48) {
        source._4_4_ = targetExhausted;
        goto LAB_00207ca4;
      }
      BVar1 = isLegalUTF8((UTF8 *)target,uVar2 + 1);
      if (BVar1 == '\0') {
        source._4_4_ = sourceIllegal;
        if (flags == strictConversion) goto LAB_00207ca4;
        uVar3 = findMaximalSubpartOfIllFormedUTF8Sequence((UTF8 *)target,sourceEnd);
        target = (UTF32 *)((long)target + (ulong)uVar3);
        *puStack_48 = 0xfffd;
        puStack_48 = puStack_48 + 1;
      }
      else {
        switch(uVar2) {
        case 5:
          local_4c = (uint)(byte)*target << 6;
          target = (UTF32 *)((long)target + 1);
        case 4:
          local_4c = ((uint)(byte)*target + local_4c) * 0x40;
          target = (UTF32 *)((long)target + 1);
        case 3:
          local_4c = ((uint)(byte)*target + local_4c) * 0x40;
          target = (UTF32 *)((long)target + 1);
        case 2:
          local_4c = ((uint)(byte)*target + local_4c) * 0x40;
          target = (UTF32 *)((long)target + 1);
        case 1:
          local_4c = ((uint)(byte)*target + local_4c) * 0x40;
          target = (UTF32 *)((long)target + 1);
        case 0:
          local_4c = (uint)(byte)*target + local_4c;
          target = (UTF32 *)((long)target + 1);
        }
        uVar3 = local_4c - *(int *)(offsetsFromUTF8 + (ulong)uVar2 * 4);
        if (uVar3 < 0x110000) {
          if ((uVar3 < 0xd800) || (0xdfff < uVar3)) {
            *puStack_48 = uVar3;
          }
          else {
            if (flags == strictConversion) {
              target = (UTF32 *)((long)target - (long)(int)(uVar2 + 1));
              source._4_4_ = sourceIllegal;
              goto LAB_00207ca4;
            }
            *puStack_48 = 0xfffd;
          }
        }
        else {
          source._4_4_ = sourceIllegal;
          *puStack_48 = 0xfffd;
        }
        puStack_48 = puStack_48 + 1;
      }
      goto LAB_00207a0f;
    }
    if ((flags == strictConversion) || (InputIsPartial != '\0')) {
      source._4_4_ = sourceExhausted;
      goto LAB_00207ca4;
    }
    source._4_4_ = sourceIllegal;
    uVar3 = findMaximalSubpartOfIllFormedUTF8Sequence((UTF8 *)target,sourceEnd);
    target = (UTF32 *)((long)target + (ulong)uVar3);
    *puStack_48 = 0xfffd;
    puStack_48 = puStack_48 + 1;
  } while( true );
}

Assistant:

static ConversionResult ConvertUTF8toUTF32Impl(
        const UTF8** sourceStart, const UTF8* sourceEnd,
        UTF32** targetStart, UTF32* targetEnd, ConversionFlags flags,
        Boolean InputIsPartial) {
    ConversionResult result = conversionOK;
    const UTF8* source = *sourceStart;
    UTF32* target = *targetStart;
    while (source < sourceEnd) {
        UTF32 ch = 0;
        unsigned short extraBytesToRead = trailingBytesForUTF8[*source];
        if (extraBytesToRead >= sourceEnd - source) {
            if (flags == strictConversion || InputIsPartial) {
                result = sourceExhausted;
                break;
            } else {
                result = sourceIllegal;

                /*
                 * Replace the maximal subpart of ill-formed sequence with
                 * replacement character.
                 */
                source += findMaximalSubpartOfIllFormedUTF8Sequence(source,
                                                                    sourceEnd);
                *target++ = UNI_REPLACEMENT_CHAR;
                continue;
            }
        }
        if (target >= targetEnd) {
            result = targetExhausted; break;
        }

        /* Do this check whether lenient or strict */
        if (!isLegalUTF8(source, extraBytesToRead+1)) {
            result = sourceIllegal;
            if (flags == strictConversion) {
                /* Abort conversion. */
                break;
            } else {
                /*
                 * Replace the maximal subpart of ill-formed sequence with
                 * replacement character.
                 */
                source += findMaximalSubpartOfIllFormedUTF8Sequence(source,
                                                                    sourceEnd);
                *target++ = UNI_REPLACEMENT_CHAR;
                continue;
            }
        }
        /*
         * The cases all fall through. See "Note A" below.
         */
        switch (extraBytesToRead) {
            case 5: ch += *source++; ch <<= 6;
            case 4: ch += *source++; ch <<= 6;
            case 3: ch += *source++; ch <<= 6;
            case 2: ch += *source++; ch <<= 6;
            case 1: ch += *source++; ch <<= 6;
            case 0: ch += *source++;
        }
        ch -= offsetsFromUTF8[extraBytesToRead];

        if (ch <= UNI_MAX_LEGAL_UTF32) {
            /*
             * UTF-16 surrogate values are illegal in UTF-32, and anything
             * over Plane 17 (> 0x10FFFF) is illegal.
             */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END) {
                if (flags == strictConversion) {
                    source -= (extraBytesToRead+1); /* return to the illegal value itself */
                    result = sourceIllegal;
                    break;
                } else {
                    *target++ = UNI_REPLACEMENT_CHAR;
                }
            } else {
                *target++ = ch;
            }
        } else { /* i.e., ch > UNI_MAX_LEGAL_UTF32 */
            result = sourceIllegal;
            *target++ = UNI_REPLACEMENT_CHAR;
        }
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}